

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68040_move16_ai_al(m68k_info *info)

{
  long in_RDI;
  int modes [2];
  int data [2];
  undefined4 in_stack_fffffffffffffff4;
  
  read_imm_32((m68k_info *)
              (CONCAT44(in_stack_fffffffffffffff4,*(undefined4 *)(in_RDI + 0x24)) &
              0xffffffff00000007));
  if ((*(uint *)(in_RDI + 0x28) & 0x10) == 0) {
    d68000_invalid((m68k_info *)0x3a971b);
  }
  else {
    build_move16(info,(int *)data,(int *)modes);
  }
  return;
}

Assistant:

static void d68040_move16_ai_al(m68k_info *info)
{
	int data[] = { info->ir & 7, read_imm_32(info) };
	int modes[] = { M68K_AM_REG_DIRECT_ADDR, M68K_AM_ABSOLUTE_DATA_LONG };

	LIMIT_CPU_TYPES(info, M68040_PLUS);

	build_move16(info, data, modes);
}